

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatorprofiletools.cpp
# Opt level: O0

string * libcellml::sha1(string *__return_storage_ptr__,string *string)

{
  array<unsigned_int,_5UL> *this;
  uint uVar1;
  _Setfill<char> _Var2;
  _Setw _Var3;
  pointer pvVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  reference pvVar8;
  iterator pvVar9;
  undefined8 uVar10;
  ostream *poVar11;
  uint32_t d;
  iterator __end1;
  iterator __begin1;
  array<unsigned_int,_5UL> *__range1;
  ostringstream result;
  ulong local_2d0;
  size_t i;
  array<unsigned_int,_16UL> block;
  size_t origSize;
  uint64_t totalBits;
  array<unsigned_int,_16UL> block_1;
  array<char,_64UL> sbuf;
  istringstream local_1e0 [8];
  istringstream is;
  uint64_t local_60;
  uint64_t transforms;
  string buffer;
  array<unsigned_int,_5UL> digest;
  string *string_local;
  
  buffer.field_2._8_8_ = 0xefcdab8967452301;
  std::__cxx11::string::string((string *)&transforms);
  local_60 = 0;
  std::__cxx11::istringstream::istringstream(local_1e0,string,8);
  while( true ) {
    block_1._M_elems[0xe] = 0;
    block_1._M_elems[0xf] = 0;
    pvVar4 = std::array<char,_64UL>::data((array<char,_64UL> *)(block_1._M_elems + 0xe));
    std::__cxx11::string::size();
    std::istream::read((char *)local_1e0,(long)pvVar4);
    pvVar4 = std::array<char,_64UL>::data((array<char,_64UL> *)(block_1._M_elems + 0xe));
    std::istream::gcount();
    std::__cxx11::string::append((char *)&transforms,(ulong)pvVar4);
    lVar5 = std::__cxx11::string::size();
    if (lVar5 != 0x40) break;
    block_1._M_elems[10] = 0;
    block_1._M_elems[0xb] = 0;
    block_1._M_elems[0xc] = 0;
    block_1._M_elems[0xd] = 0;
    block_1._M_elems[6] = 0;
    block_1._M_elems[7] = 0;
    block_1._M_elems[8] = 0;
    block_1._M_elems[9] = 0;
    block_1._M_elems[2] = 0;
    block_1._M_elems[3] = 0;
    block_1._M_elems[4] = 0;
    block_1._M_elems[5] = 0;
    totalBits = 0;
    block_1._M_elems[0] = 0;
    block_1._M_elems[1] = 0;
    bufferToBlock((string *)&transforms,(array<unsigned_int,_16UL> *)&totalBits);
    transform((array<unsigned_int,_5UL> *)((long)&buffer.field_2 + 8),
              (array<unsigned_int,_16UL> *)&totalBits,&local_60);
    std::__cxx11::string::clear();
  }
  lVar5 = local_60 * 0x40;
  lVar6 = std::__cxx11::string::size();
  lVar5 = (lVar5 + lVar6) * 8;
  std::__cxx11::string::operator+=((string *)&transforms,anon_var_dwarf_17005d);
  block._M_elems._56_8_ = std::__cxx11::string::size();
  while (uVar7 = std::__cxx11::string::size(), uVar7 < 0x40) {
    std::__cxx11::string::operator+=((string *)&transforms,'\0');
  }
  block._M_elems[10] = 0;
  block._M_elems[0xb] = 0;
  block._M_elems[0xc] = 0;
  block._M_elems[0xd] = 0;
  block._M_elems[6] = 0;
  block._M_elems[7] = 0;
  block._M_elems[8] = 0;
  block._M_elems[9] = 0;
  block._M_elems[2] = 0;
  block._M_elems[3] = 0;
  block._M_elems[4] = 0;
  block._M_elems[5] = 0;
  i = 0;
  block._M_elems[0] = 0;
  block._M_elems[1] = 0;
  bufferToBlock((string *)&transforms,(array<unsigned_int,_16UL> *)&i);
  if (0x38 < (ulong)block._M_elems._56_8_) {
    transform((array<unsigned_int,_5UL> *)((long)&buffer.field_2 + 8),
              (array<unsigned_int,_16UL> *)&i,&local_60);
    for (local_2d0 = 0; local_2d0 < 0xe; local_2d0 = local_2d0 + 1) {
      pvVar8 = std::array<unsigned_int,_16UL>::at((array<unsigned_int,_16UL> *)&i,local_2d0);
      *pvVar8 = 0;
    }
  }
  origSize._0_4_ = (value_type_conflict4)lVar5;
  pvVar8 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0xf);
  *pvVar8 = (value_type_conflict4)origSize;
  origSize._4_4_ = (value_type_conflict4)((ulong)lVar5 >> 0x20);
  pvVar8 = std::array<unsigned_int,_16UL>::operator[]((array<unsigned_int,_16UL> *)&i,0xe);
  *pvVar8 = origSize._4_4_;
  transform((array<unsigned_int,_5UL> *)((long)&buffer.field_2 + 8),(array<unsigned_int,_16UL> *)&i,
            &local_60);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range1);
  this = (array<unsigned_int,_5UL> *)((long)&buffer.field_2 + 8);
  __end1 = std::array<unsigned_int,_5UL>::begin(this);
  pvVar9 = std::array<unsigned_int,_5UL>::end(this);
  for (; __end1 != pvVar9; __end1 = __end1 + 1) {
    uVar1 = *__end1;
    uVar10 = std::ostream::operator<<((ostream *)&__range1,std::hex);
    _Var2 = std::setfill<char>('0');
    poVar11 = std::operator<<(uVar10,_Var2._M_c);
    _Var3 = std::setw(8);
    std::operator<<(poVar11,_Var3);
    std::ostream::operator<<((ostream *)&__range1,uVar1);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range1);
  std::__cxx11::istringstream::~istringstream(local_1e0);
  std::__cxx11::string::~string((string *)&transforms);
  return __return_storage_ptr__;
}

Assistant:

std::string sha1(const std::string &string)
{
    std::array<uint32_t, 5> digest = {0x67452301, 0xefcdab89, 0x98badcfe, 0x10325476, 0xc3d2e1f0};
    std::string buffer;
    uint64_t transforms = 0;
    std::istringstream is(string);

    while (true) {
        std::array<char, BLOCK_BYTES> sbuf = {};

        is.read(sbuf.data(), int64_t(BLOCK_BYTES - buffer.size()));

        buffer.append(sbuf.data(), size_t(is.gcount()));

        if (buffer.size() != BLOCK_BYTES) {
            break;
        }

        std::array<uint32_t, BLOCK_INTS> block = {};

        bufferToBlock(buffer, block);
        transform(digest, block, transforms);

        buffer.clear();
    }

    uint64_t totalBits = (transforms * BLOCK_BYTES + buffer.size()) * 8;

    buffer += "\x80";

    size_t origSize = buffer.size();

    while (buffer.size() < BLOCK_BYTES) {
        buffer += char(0x00);
    }

    std::array<uint32_t, BLOCK_INTS> block = {};

    bufferToBlock(buffer, block);

    if (origSize > BLOCK_BYTES - 8) {
        transform(digest, block, transforms);

        for (size_t i = 0; i < BLOCK_INTS - 2; ++i) {
            block.at(i) = 0;
        }
    }

    block[BLOCK_INTS - 1] = uint32_t(totalBits);
    block[BLOCK_INTS - 2] = uint32_t(totalBits >> 32U);

    transform(digest, block, transforms);

    std::ostringstream result;

    for (uint32_t d : digest) {
        result << std::hex << std::setfill('0') << std::setw(8);
        result << d;
    }

    return result.str();
}